

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall
chrono::ChAssembly::RemoveMesh(ChAssembly *this,shared_ptr<chrono::fea::ChMesh> *mesh)

{
  element_type *peVar1;
  __normal_iterator<std::shared_ptr<chrono::fea::ChMesh>_*,_std::vector<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>_>
  __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::fea::ChMesh>*,std::vector<std::shared_ptr<chrono::fea::ChMesh>,std::allocator<std::shared_ptr<chrono::fea::ChMesh>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<chrono::fea::ChMesh>const>>
                         ((this->meshlist).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->meshlist).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,mesh);
  if (__position._M_current !=
      (this->meshlist).
      super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
    ::_M_erase(&this->meshlist,(iterator)__position._M_current);
    peVar1 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar1->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[6])(peVar1,0);
    ((this->super_ChPhysicsItem).system)->is_updated = false;
    return;
  }
  __assert_fail("itr != meshlist.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChAssembly.cpp"
                ,0xdf,"void chrono::ChAssembly::RemoveMesh(std::shared_ptr<fea::ChMesh>)");
}

Assistant:

void ChAssembly::RemoveMesh(std::shared_ptr<fea::ChMesh> mesh) {
    auto itr = std::find(std::begin(meshlist), std::end(meshlist), mesh);
    assert(itr != meshlist.end());

    meshlist.erase(itr);
    mesh->SetSystem(nullptr);

    system->is_updated = false;
}